

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

_Bool xfer_download_data(fxp_xfer *xfer,void **buf,int *len)

{
  req *ptr;
  bool bVar1;
  req *rr;
  char *pcStack_30;
  int retlen;
  void *retbuf;
  int *len_local;
  void **buf_local;
  fxp_xfer *xfer_local;
  
  pcStack_30 = (char *)0x0;
  rr._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if ((xfer->head != (req *)0x0) && (bVar1 = false, xfer->head->complete != 0)) {
      bVar1 = pcStack_30 == (char *)0x0;
    }
    if (!bVar1) break;
    ptr = xfer->head;
    if (0 < ptr->complete) {
      pcStack_30 = ptr->buffer;
      rr._4_4_ = ptr->retlen;
    }
    xfer->head = xfer->head->next;
    if (xfer->head == (req *)0x0) {
      xfer->tail = (req *)0x0;
    }
    else {
      xfer->head->prev = (req *)0x0;
    }
    xfer->req_totalsize = xfer->req_totalsize - ptr->len;
    safefree(ptr);
  }
  if (pcStack_30 != (char *)0x0) {
    *buf = pcStack_30;
    *len = rr._4_4_;
  }
  return pcStack_30 != (char *)0x0;
}

Assistant:

bool xfer_download_data(struct fxp_xfer *xfer, void **buf, int *len)
{
    void *retbuf = NULL;
    int retlen = 0;

    /*
     * Discard anything at the head of the rr queue with complete <
     * 0; return the first thing with complete > 0.
     */
    while (xfer->head && xfer->head->complete && !retbuf) {
        struct req *rr = xfer->head;

        if (rr->complete > 0) {
            retbuf = rr->buffer;
            retlen = rr->retlen;
#ifdef DEBUG_DOWNLOAD
            printf("handing back data from read request %p\n", rr);
#endif
        }
#ifdef DEBUG_DOWNLOAD
        else
            printf("skipping failed read request %p\n", rr);
#endif

        xfer->head = xfer->head->next;
        if (xfer->head)
            xfer->head->prev = NULL;
        else
            xfer->tail = NULL;
        xfer->req_totalsize -= rr->len;
        sfree(rr);
    }

    if (retbuf) {
        *buf = retbuf;
        *len = retlen;
        return true;
    } else
        return false;
}